

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uppity.c
# Opt level: O1

int main(int argc,char **argv)

{
  ssh_key *psVar1;
  size_t sVar2;
  ssh_key **ppsVar3;
  bool bVar4;
  cmdline_instance *pcVar5;
  _Bool _Var6;
  int iVar7;
  uint uVar8;
  cmdline_instance *pcVar9;
  ssh2_userkey *ptr;
  AuthPolicy_ssh2_pubkey *pAVar10;
  Filename *pFVar11;
  cmdline_instance *pcVar12;
  RSAKey *pRVar13;
  FILE *__stream;
  AuthPolicy_ssh1_pubkey *rsa;
  size_t sVar14;
  int *piVar15;
  Conf *pCVar16;
  char *pcVar17;
  ulong uVar18;
  size_t sVar19;
  unsigned_long uVar20;
  cmdline_instance *pcVar21;
  cmdline_instance *unaff_R13;
  cmdline_instance *unaff_R15;
  ptrlen pl;
  char *val;
  char *error_2;
  char *error;
  size_t instancessize;
  int local_a4;
  cmdline_instance *local_a0;
  cmdline_instance *local_98;
  char **local_90;
  cmdline_instance *local_88;
  cmdline_instance *local_80;
  cmdline_instance *local_78;
  char *local_70;
  BinarySource local_68;
  cmdline_instance *local_40;
  size_t local_38;
  
  local_38 = 8;
  local_a4 = argc;
  local_90 = argv;
  pcVar9 = (cmdline_instance *)safemalloc(8,0x110,0);
  init_cmdline_instance(pcVar9);
  if (argc < 2) {
    show_help((FILE *)_stderr);
    fputc(10,_stderr);
  }
  local_78 = pcVar9;
  if (local_a4 < 2) {
    local_80 = (cmdline_instance *)0x1;
    local_a4 = local_a4 + -1;
LAB_00110656:
    pcVar21 = local_78;
    pcVar9 = local_80;
    pcVar12 = local_80;
    pcVar5 = local_78;
    if (((cmdline_instance *)0x1 < local_80) && (listen_once == '\x01')) {
LAB_001107fb:
      main_cold_22();
LAB_00110800:
      main_cold_16();
      pcVar9 = unaff_R15;
LAB_0011080d:
      unaff_R15 = pcVar9;
      main_cold_10();
LAB_00110819:
      main_cold_11();
      pcVar21 = unaff_R13;
LAB_00110828:
      unaff_R13 = pcVar21;
      main_cold_17();
LAB_00110832:
      main_cold_14();
      pcVar21 = unaff_R13;
      pcVar9 = unaff_R15;
LAB_0011083d:
      main_cold_12();
      unaff_R13 = pcVar21;
LAB_00110847:
      main_cold_13();
LAB_00110856:
      main_cold_5();
LAB_00110860:
      main_cold_6();
      pcVar21 = unaff_R13;
      pcVar12 = pcVar9;
LAB_0011086a:
      main_cold_7();
LAB_00110876:
      main_cold_8();
LAB_00110885:
      main_cold_9();
LAB_00110894:
      main_cold_4();
LAB_0011089c:
      pl.len = (size_t)pcVar12;
      pl.ptr = pcVar21;
      main_cold_3();
LAB_001108a4:
      pcVar9 = (cmdline_instance *)pl.len;
      main_cold_2();
LAB_001108af:
      main_cold_1();
      *(undefined4 *)&((ptrlen *)&pcVar9->listen_port)->ptr = 0xffffffff;
      pcVar9->listen_socket = (char *)0x0;
      pcVar9->hostkeys = (ssh_key **)0x0;
      pcVar9->nhostkeys = 0;
      pcVar9->hostkeysize = 0;
      pcVar9->hostkey1 = (RSAKey *)0x0;
      pCVar16 = make_ssh_server_conf();
      pcVar9->conf = pCVar16;
      memset(&pcVar9->aps,0,0xd0);
      (pcVar9->ssc).application_name = "Uppity";
      pcVar17 = getenv("HOME");
      (pcVar9->ssc).session_starting_dir = pcVar17;
      (pcVar9->ssc).ssh1_cipher_mask = 0x4c;
      (pcVar9->ssc).ssh1_allow_compression = true;
      pcVar9->auth_methods = 0x3e;
      return (int)pcVar17;
    }
    while( true ) {
      if (pcVar12 == (cmdline_instance *)0x0) {
        random_ref();
        putty_signal(0xd,(_func_void_int *)0x1);
        sk_init();
        uxsel_init();
        for (; pcVar9 != (cmdline_instance *)0x0;
            pcVar9 = (cmdline_instance *)((long)&pcVar9[-1].conf + 7)) {
          piVar15 = (int *)safemalloc(1,0x50,0);
          iVar7 = cmdline_instance_start_next_server_config_id + 1;
          *piVar15 = cmdline_instance_start_next_server_config_id;
          cmdline_instance_start_next_server_config_id = iVar7;
          *(Conf **)(piVar15 + 2) = pcVar21->conf;
          *(SshServerConfig **)(piVar15 + 4) = &pcVar21->ssc;
          *(ssh_key ***)(piVar15 + 6) = pcVar21->hostkeys;
          piVar15[8] = (int)pcVar21->nhostkeys;
          *(RSAKey **)(piVar15 + 10) = pcVar21->hostkey1;
          *(AuthPolicyShared **)(piVar15 + 0xe) = &pcVar21->aps;
          piVar15[0xc] = pcVar21->auth_methods;
          if ((pcVar21->listen_port < 0) && (pcVar21->listen_socket == (char *)0x0)) {
            main_cold_20();
          }
          else {
            main_cold_21();
          }
          pcVar21 = pcVar21 + 1;
        }
        cli_main_loop(cliloop_no_pw_setup,cliloop_no_pw_check,cliloop_always_continue,(void *)0x0);
        return 0;
      }
      if ((pcVar5->nhostkeys == 0) && (pcVar5->hostkey1 == (RSAKey *)0x0)) break;
      if ((((cmdline_instance *)0x1 < local_80) && (pcVar5->listen_port < 0)) &&
         (pcVar5->listen_socket == (char *)0x0)) goto LAB_001107f6;
      pcVar12 = (cmdline_instance *)((long)&pcVar12[-1].conf + 7);
      pcVar5 = pcVar5 + 1;
    }
    main_cold_19();
LAB_001107ee:
    main_cold_15();
LAB_001107f6:
    main_cold_18();
    goto LAB_001107fb;
  }
  local_80 = (cmdline_instance *)0x1;
  local_a4 = local_a4 + -1;
  local_98 = pcVar9;
LAB_0010fad6:
  unaff_R13 = (cmdline_instance *)0x0;
  pcVar21 = (cmdline_instance *)0x0;
  pcVar9 = (cmdline_instance *)local_90[1];
  local_90 = local_90 + 1;
  iVar7 = strcmp((char *)pcVar9,"--help");
  if (iVar7 == 0) {
    show_help(_stdout);
LAB_001107e2:
    exit(0);
  }
  _Var6 = longoptnoarg((char *)pcVar9,"--version");
  if (_Var6) {
    pcVar17 = buildinfo("\n");
    printf("%s: %s\n%s\n","Uppity","Unidentified build",pcVar17);
    safefree(pcVar17);
    goto LAB_001107e2;
  }
  _Var6 = longoptnoarg((char *)pcVar9,"--verbose");
  if ((_Var6) || (iVar7 = strcmp((char *)pcVar9,"-v"), iVar7 == 0)) {
    verbose = 1;
  }
  else {
    _Var6 = longoptnoarg((char *)pcVar9,"--and");
    pcVar12 = local_80;
    if (_Var6) {
      local_78 = (cmdline_instance *)
                 safegrowarray(local_78,&local_38,0x110,(size_t)local_80,1,false);
      pcVar9 = (cmdline_instance *)((long)&((ptrlen *)&pcVar12->listen_port)->ptr + 1);
      local_98 = local_78 + (long)pcVar12;
      local_80 = pcVar9;
      init_cmdline_instance(local_98);
    }
    else {
      _Var6 = longoptarg((char *)pcVar9,"--listen",(char **)&local_a0,&local_a4,&local_90);
      if (_Var6) {
        if (*(char *)&((ptrlen *)&local_a0->listen_port)->ptr == '/') {
          *(undefined4 *)&((ptrlen *)&local_98->listen_port)->ptr = 0xffffffff;
          local_98->listen_socket = (char *)local_a0;
        }
        else {
          iVar7 = atoi((char *)local_a0);
          *(int *)&((ptrlen *)&local_98->listen_port)->ptr = iVar7;
          local_98->listen_socket = (char *)0x0;
        }
      }
      else {
        iVar7 = strcmp((char *)pcVar9,"--listen-once");
        if (iVar7 == 0) {
          listen_once = '\x01';
        }
        else {
          _Var6 = longoptarg((char *)pcVar9,"--hostkey",(char **)&local_a0,&local_a4,&local_90);
          unaff_R15 = local_a0;
          if (_Var6) {
            local_88 = (cmdline_instance *)filename_from_str((char *)local_a0);
            iVar7 = key_type((Filename *)local_88);
            unaff_R13 = local_88;
            pcVar9 = local_98;
            if (iVar7 == 2) {
              local_40 = unaff_R15;
              if (local_98->hostkey1 != (RSAKey *)0x0) goto LAB_0011083d;
              pRVar13 = (RSAKey *)safemalloc(1,0x48,0);
              pcVar9->hostkey1 = pRVar13;
              iVar7 = rsa1_load_f((Filename *)local_88,pRVar13,(char *)0x0,(char **)&local_68);
              unaff_R13 = pcVar21;
              if (iVar7 == 0) goto LAB_00110847;
            }
            else {
              if (iVar7 != 3) goto LAB_00110828;
              ptr = ppk_load_f((Filename *)local_88,(char *)0x0,(char **)&local_68);
              filename_free((Filename *)unaff_R13);
              if ((ptr == (ssh2_userkey *)0x0) || (psVar1 = ptr->key, psVar1 == (ssh_key *)0x0))
              goto LAB_00110800;
              pcVar17 = (*psVar1->vt->invalid)(psVar1,0);
              if (pcVar17 != (char *)0x0) goto LAB_00110832;
              local_88 = (cmdline_instance *)ptr->key;
              safefree(ptr->comment);
              safefree(ptr);
              pcVar9 = local_98;
              sVar2 = local_98->nhostkeys;
              if (sVar2 != 0) {
                sVar19 = 0;
                do {
                  if (*(&(((AuthPolicy_ssh2_pubkey *)local_98->hostkeys)->public_blob).ptr)[sVar19]
                      == *(long *)local_88) goto LAB_001107ee;
                  sVar19 = sVar19 + 1;
                } while (sVar2 != sVar19);
              }
              pAVar10 = (AuthPolicy_ssh2_pubkey *)
                        safegrowarray((AuthPolicy_ssh2_pubkey *)local_98->hostkeys,
                                      &local_98->hostkeysize,8,sVar2,1,false);
              pcVar9->hostkeys = (ssh_key **)pAVar10;
              sVar2 = pcVar9->nhostkeys;
              pcVar9->nhostkeys = sVar2 + 1;
              (&(pAVar10->public_blob).ptr)[sVar2] = local_88;
              pcVar9 = unaff_R15;
            }
          }
          else {
            _Var6 = longoptarg((char *)pcVar9,"--rsakexkey",(char **)&local_a0,&local_a4,&local_90);
            if (_Var6) {
              local_88 = local_a0;
              pFVar11 = filename_from_str((char *)local_a0);
              iVar7 = key_type(pFVar11);
              unaff_R15 = local_98;
              if (iVar7 != 2) goto LAB_0011080d;
              pRVar13 = (local_98->ssc).rsa_kex_key;
              if (pRVar13 == (RSAKey *)0x0) {
                pRVar13 = (RSAKey *)safemalloc(1,0x48,0);
                (unaff_R15->ssc).rsa_kex_key = pRVar13;
              }
              else {
                freersakey(pRVar13);
              }
              iVar7 = rsa1_load_f(pFVar11,(unaff_R15->ssc).rsa_kex_key,(char *)0x0,
                                  (char **)&local_68);
              if (iVar7 == 0) goto LAB_00110819;
              (((unaff_R15->ssc).rsa_kex_key)->sshk).vt = &ssh_rsa;
              pcVar9 = unaff_R15;
            }
            else {
              _Var6 = longoptarg((char *)pcVar9,"--userkey",(char **)&local_a0,&local_a4,&local_90);
              if (_Var6) {
                local_88 = local_a0;
                pFVar11 = filename_from_str((char *)local_a0);
                iVar7 = key_type(pFVar11);
                if (iVar7 - 9U < 2) {
                  pcVar12 = (cmdline_instance *)strbuf_new();
                  _Var6 = ppk_loadpub_f(pFVar11,(char **)0x0,(BinarySink *)&pcVar12->nhostkeys,
                                        (char **)0x0,&local_70);
                  if (!_Var6) goto LAB_00110885;
                  pAVar10 = (AuthPolicy_ssh2_pubkey *)safemalloc(1,0x18,(size_t)pcVar12->hostkeys);
                  local_88 = (cmdline_instance *)(pAVar10 + 1);
                  memcpy(local_88,pcVar12->listen_socket,(size_t)pcVar12->hostkeys);
                  ppsVar3 = pcVar12->hostkeys;
                  (pAVar10->public_blob).ptr = local_88;
                  (pAVar10->public_blob).len = (size_t)ppsVar3;
                  pAVar10->next = (local_98->aps).ssh2keys;
                  (local_98->aps).ssh2keys = pAVar10;
                }
                else {
                  pcVar12 = pcVar9;
                  if (iVar7 != 8) goto LAB_0011086a;
                  pcVar12 = (cmdline_instance *)strbuf_new();
                  iVar7 = rsa1_loadpub_f(pFVar11,(BinarySink *)&pcVar12->nhostkeys,(char **)0x0,
                                         &local_70);
                  if (iVar7 == 0) goto LAB_00110876;
                  rsa = (AuthPolicy_ssh1_pubkey *)safemalloc(1,0x50,0);
                  local_68.data = pcVar12->listen_socket;
                  local_68.len = (size_t)pcVar12->hostkeys;
                  local_68.pos = 0;
                  local_68.err = BSE_NO_ERROR;
                  local_68.binarysource_ = &local_68;
                  BinarySource_get_rsa_ssh1_pub
                            (local_68.binarysource_,(RSAKey *)rsa,RSA_SSH1_EXPONENT_FIRST);
                  rsa->next = (local_98->aps).ssh1keys;
                  (local_98->aps).ssh1keys = rsa;
                }
                strbuf_free((strbuf *)pcVar12);
                pcVar9 = pcVar12;
              }
              else {
                _Var6 = longoptarg((char *)pcVar9,"--bannerfile",(char **)&local_a0,&local_a4,
                                   &local_90);
                if (_Var6) {
                  local_88 = local_a0;
                  __stream = fopen((char *)local_a0,"r");
                  if (__stream == (FILE *)0x0) goto LAB_00110860;
                  pcVar9 = (cmdline_instance *)strbuf_new();
                  _Var6 = read_file_into((BinarySink *)&pcVar9->nhostkeys,(FILE *)__stream);
                  if (!_Var6) goto LAB_00110856;
                  fclose(__stream);
                  ppsVar3 = pcVar9->hostkeys;
                  (local_98->ssc).banner.ptr = pcVar9->listen_socket;
                  (local_98->ssc).banner.len = (size_t)ppsVar3;
                }
                else {
                  _Var6 = longoptarg((char *)pcVar9,"--bannertext",(char **)&local_a0,&local_a4,
                                     &local_90);
                  pcVar12 = local_a0;
                  if (_Var6) {
                    sVar14 = strlen((char *)local_a0);
                    (local_98->ssc).banner.ptr = pcVar12;
                    (local_98->ssc).banner.len = sVar14;
                    pcVar9 = pcVar12;
                  }
                  else {
                    _Var6 = longoptarg((char *)pcVar9,"--sessiondir",(char **)&local_a0,&local_a4,
                                       &local_90);
                    if (_Var6) {
                      (local_98->ssc).session_starting_dir = (char *)local_a0;
                    }
                    else {
                      _Var6 = longoptarg((char *)pcVar9,"--kexinit-kex",(char **)&local_a0,&local_a4
                                         ,&local_90);
                      pcVar12 = local_a0;
                      if (_Var6) {
                        sVar14 = strlen((char *)local_a0);
                        (local_98->ssc).kex_override[0].ptr = pcVar12;
                        (local_98->ssc).kex_override[0].len = sVar14;
                        pcVar9 = pcVar12;
                      }
                      else {
                        _Var6 = longoptarg((char *)pcVar9,"--kexinit-hostkey",(char **)&local_a0,
                                           &local_a4,&local_90);
                        pcVar12 = local_a0;
                        if (_Var6) {
                          sVar14 = strlen((char *)local_a0);
                          (local_98->ssc).kex_override[1].ptr = pcVar12;
                          (local_98->ssc).kex_override[1].len = sVar14;
                          pcVar9 = pcVar12;
                        }
                        else {
                          _Var6 = longoptarg((char *)pcVar9,"--kexinit-cscipher",(char **)&local_a0,
                                             &local_a4,&local_90);
                          pcVar12 = local_a0;
                          if (_Var6) {
                            sVar14 = strlen((char *)local_a0);
                            (local_98->ssc).kex_override[2].ptr = pcVar12;
                            (local_98->ssc).kex_override[2].len = sVar14;
                            pcVar9 = pcVar12;
                          }
                          else {
                            _Var6 = longoptarg((char *)pcVar9,"--kexinit-csmac",(char **)&local_a0,
                                               &local_a4,&local_90);
                            pcVar12 = local_a0;
                            if (_Var6) {
                              sVar14 = strlen((char *)local_a0);
                              (local_98->ssc).kex_override[4].ptr = pcVar12;
                              (local_98->ssc).kex_override[4].len = sVar14;
                              pcVar9 = pcVar12;
                            }
                            else {
                              _Var6 = longoptarg((char *)pcVar9,"--kexinit-cscomp",
                                                 (char **)&local_a0,&local_a4,&local_90);
                              pcVar12 = local_a0;
                              if (_Var6) {
                                sVar14 = strlen((char *)local_a0);
                                (local_98->ssc).kex_override[6].ptr = pcVar12;
                                (local_98->ssc).kex_override[6].len = sVar14;
                                pcVar9 = pcVar12;
                              }
                              else {
                                _Var6 = longoptarg((char *)pcVar9,"--kexinit-sccipher",
                                                   (char **)&local_a0,&local_a4,&local_90);
                                pcVar12 = local_a0;
                                if (_Var6) {
                                  sVar14 = strlen((char *)local_a0);
                                  (local_98->ssc).kex_override[3].ptr = pcVar12;
                                  (local_98->ssc).kex_override[3].len = sVar14;
                                  pcVar9 = pcVar12;
                                }
                                else {
                                  _Var6 = longoptarg((char *)pcVar9,"--kexinit-scmac",
                                                     (char **)&local_a0,&local_a4,&local_90);
                                  pcVar12 = local_a0;
                                  if (_Var6) {
                                    sVar14 = strlen((char *)local_a0);
                                    (local_98->ssc).kex_override[5].ptr = pcVar12;
                                    (local_98->ssc).kex_override[5].len = sVar14;
                                    pcVar9 = pcVar12;
                                  }
                                  else {
                                    _Var6 = longoptarg((char *)pcVar9,"--kexinit-sccomp",
                                                       (char **)&local_a0,&local_a4,&local_90);
                                    pcVar12 = local_a0;
                                    if (_Var6) {
                                      sVar14 = strlen((char *)local_a0);
                                      (local_98->ssc).kex_override[7].ptr = pcVar12;
                                      (local_98->ssc).kex_override[7].len = sVar14;
                                      pcVar9 = pcVar12;
                                    }
                                    else {
                                      _Var6 = longoptarg((char *)pcVar9,"--allow-auth",
                                                         (char **)&local_a0,&local_a4,&local_90);
                                      pcVar12 = local_a0;
                                      if (_Var6) {
                                        uVar8 = auth_method_from_name((char *)local_a0);
                                        if (uVar8 == 0) goto LAB_00110894;
                                        local_98->auth_methods = local_98->auth_methods | uVar8;
                                        pcVar9 = pcVar12;
                                      }
                                      else {
                                        _Var6 = longoptarg((char *)pcVar9,"--deny-auth",
                                                           (char **)&local_a0,&local_a4,&local_90);
                                        pcVar12 = local_a0;
                                        if (_Var6) {
                                          uVar8 = auth_method_from_name((char *)local_a0);
                                          if (uVar8 == 0) goto LAB_0011089c;
                                          local_98->auth_methods = local_98->auth_methods & ~uVar8;
                                          pcVar9 = pcVar12;
                                        }
                                        else {
                                          _Var6 = longoptarg((char *)pcVar9,"--ssh1-ciphers",
                                                             (char **)&local_a0,&local_a4,&local_90)
                                          ;
                                          pcVar21 = local_a0;
                                          if (_Var6) {
                                            local_68.pos = strlen((char *)local_a0);
                                            local_68.data = pcVar21;
                                            pl = ptrlen_get_word((ptrlen *)&local_68,",");
                                            if (pl.len == 0) {
                                              uVar20 = 0;
                                            }
                                            else {
                                              uVar20 = 0;
                                              do {
                                                _Var6 = ptrlen_eq_string(pl,"3des");
                                                uVar18 = 8;
                                                if (!_Var6) {
                                                  _Var6 = ptrlen_eq_string(pl,"blowfish");
                                                  uVar18 = 0x40;
                                                  if (!_Var6) {
                                                    _Var6 = ptrlen_eq_string(pl,"des");
                                                    uVar18 = 4;
                                                    if (!_Var6) goto LAB_001108a4;
                                                  }
                                                }
                                                uVar20 = uVar20 | uVar18;
                                                pl = ptrlen_get_word((ptrlen *)&local_68,",");
                                              } while (pl.len != 0);
                                              pcVar21 = (cmdline_instance *)0x0;
                                            }
                                            (local_98->ssc).ssh1_cipher_mask = uVar20;
                                            pcVar9 = pcVar21;
                                          }
                                          else {
                                            _Var6 = longoptnoarg((char *)pcVar9,
                                                                 "--ssh1-no-compression");
                                            if (_Var6) {
                                              (local_98->ssc).ssh1_allow_compression = false;
                                            }
                                            else {
                                              _Var6 = longoptnoarg((char *)pcVar9,"--exitsignum");
                                              if (_Var6) {
                                                (local_98->ssc).exit_signal_numeric = true;
                                              }
                                              else {
                                                _Var6 = longoptarg((char *)pcVar9,"--sshlog",
                                                                   (char **)&local_a0,&local_a4,
                                                                   &local_90);
                                                if ((_Var6) ||
                                                   (_Var6 = longoptarg((char *)pcVar9,"-sshlog",
                                                                       (char **)&local_a0,&local_a4,
                                                                       &local_90), _Var6)) {
                                                  pcVar9 = (cmdline_instance *)
                                                           filename_from_str((char *)local_a0);
                                                  pcVar21 = local_98;
                                                  conf_set_filename(local_98->conf,0x81,
                                                                    (Filename *)pcVar9);
                                                  filename_free((Filename *)pcVar9);
                                                  pCVar16 = pcVar21->conf;
                                                  iVar7 = 3;
                                                }
                                                else {
                                                  _Var6 = longoptarg((char *)pcVar9,"--sshrawlog",
                                                                     (char **)&local_a0,&local_a4,
                                                                     &local_90);
                                                  if ((!_Var6) &&
                                                     (_Var6 = longoptarg((char *)pcVar9,"-sshrawlog"
                                                                         ,(char **)&local_a0,
                                                                         &local_a4,&local_90),
                                                     !_Var6)) {
                                                    iVar7 = strcmp((char *)pcVar9,
                                                                   "--pretend-to-accept-any-pubkey")
                                                    ;
                                                    if (iVar7 == 0) {
                                                      (local_98->ssc).
                                                      stunt_pretend_to_accept_any_pubkey = true;
                                                    }
                                                    else {
                                                      iVar7 = strcmp((char *)pcVar9,
                                                                                                                                          
                                                  "--open-unconditional-agent-socket");
                                                  if (iVar7 == 0) {
                                                    (local_98->ssc).
                                                    stunt_open_unconditional_agent_socket = true;
                                                  }
                                                  else {
                                                    iVar7 = strcmp((char *)pcVar9,
                                                                   "--allow-none-auth");
                                                    if (iVar7 == 0) {
                                                      *(byte *)&local_98->auth_methods =
                                                           (byte)local_98->auth_methods | 1;
                                                    }
                                                    else {
                                                      iVar7 = strcmp((char *)pcVar9,
                                                                     "--allow-trivial-ki-auth");
                                                      if (iVar7 != 0) {
                                                        iVar7 = strcmp((char *)pcVar9,
                                                                                                                                              
                                                  "--return-success-to-pubkey-offer");
                                                  if (iVar7 == 0) {
                                                    (local_98->ssc).
                                                    stunt_return_success_to_pubkey_offer = true;
                                                    goto LAB_0010fb96;
                                                  }
                                                  goto LAB_001108af;
                                                  }
                                                  (local_98->ssc).stunt_allow_trivial_ki_auth = true
                                                  ;
                                                  }
                                                  }
                                                  }
                                                  goto LAB_0010fb96;
                                                  }
                                                  pcVar9 = (cmdline_instance *)
                                                           filename_from_str((char *)local_a0);
                                                  pcVar21 = local_98;
                                                  conf_set_filename(local_98->conf,0x81,
                                                                    (Filename *)pcVar9);
                                                  filename_free((Filename *)pcVar9);
                                                  pCVar16 = pcVar21->conf;
                                                  iVar7 = 4;
                                                }
                                                conf_set_int(pCVar16,0x82,iVar7);
                                                conf_set_int(pcVar21->conf,0x83,1);
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0010fb96:
  unaff_R13 = (cmdline_instance *)0x0;
  iVar7 = local_a4 + -1;
  bVar4 = local_a4 < 2;
  unaff_R15 = pcVar9;
  local_a4 = iVar7;
  if (bVar4) goto LAB_00110656;
  goto LAB_0010fad6;
}

Assistant:

int main(int argc, char **argv)
{
    size_t ninstances = 0, instancessize = 8;
    struct cmdline_instance *instances = snewn(
        instancessize, struct cmdline_instance);
    struct cmdline_instance *ci = &instances[ninstances++];
    init_cmdline_instance(ci);

    if (argc <= 1) {
        /*
         * We're going to terminate with an error message below,
         * because there are no host keys. But we'll display the help
         * as additional standard-error output, if nothing else so
         * that people see the giant safety warning.
         */
        show_help(stderr);
        fputc('\n', stderr);
    }

    while (--argc > 0) {
        const char *arg = *++argv;
        const char *val;

        if (!strcmp(arg, "--help")) {
            show_help(stdout);
            exit(0);
        } else if (longoptnoarg(arg, "--version")) {
            show_version_and_exit();
        } else if (longoptnoarg(arg, "--verbose") || !strcmp(arg, "-v")) {
            verbose = true;
        } else if (longoptnoarg(arg, "--and")) {
            sgrowarray(instances, instancessize, ninstances);
            ci = &instances[ninstances++];
            init_cmdline_instance(ci);
        } else if (longoptarg(arg, "--listen", &val, &argc, &argv)) {
            if (val[0] == '/') {
                ci->listen_port = -1;
                ci->listen_socket = val;
            } else {
                ci->listen_port = atoi(val);
                ci->listen_socket = NULL;
            }
        } else if (!strcmp(arg, "--listen-once")) {
            listen_once = true;
        } else if (longoptarg(arg, "--hostkey", &val, &argc, &argv)) {
            Filename *keyfile;
            int keytype;
            const char *error;

            keyfile = filename_from_str(val);
            keytype = key_type(keyfile);

            if (keytype == SSH_KEYTYPE_SSH2) {
                ssh2_userkey *uk;
                ssh_key *key;
                uk = ppk_load_f(keyfile, NULL, &error);
                filename_free(keyfile);
                if (!uk || !uk->key) {
                    fprintf(stderr, "%s: unable to load host key '%s': "
                            "%s\n", appname, val, error);
                    exit(1);
                }
                char *invalid = ssh_key_invalid(uk->key, 0);
                if (invalid) {
                    fprintf(stderr, "%s: host key '%s' is unusable: "
                            "%s\n", appname, val, invalid);
                    exit(1);
                }
                key = uk->key;
                sfree(uk->comment);
                sfree(uk);

                for (int i = 0; i < ci->nhostkeys; i++)
                    if (ssh_key_alg(ci->hostkeys[i]) == ssh_key_alg(key)) {
                        fprintf(stderr, "%s: host key '%s' duplicates key "
                                "type %s\n", appname, val,
                                ssh_key_alg(key)->ssh_id);
                        exit(1);
                    }

                sgrowarray(ci->hostkeys, ci->hostkeysize, ci->nhostkeys);
                ci->hostkeys[ci->nhostkeys++] = key;
            } else if (keytype == SSH_KEYTYPE_SSH1) {
                if (ci->hostkey1) {
                    fprintf(stderr, "%s: host key '%s' is a redundant "
                            "SSH-1 host key\n", appname, val);
                    exit(1);
                }
                ci->hostkey1 = snew(RSAKey);
                if (!rsa1_load_f(keyfile, ci->hostkey1, NULL, &error)) {
                    fprintf(stderr, "%s: unable to load host key '%s': "
                            "%s\n", appname, val, error);
                    exit(1);
                }
            } else {
                fprintf(stderr, "%s: '%s' is not loadable as a "
                        "private key (%s)", appname, val,
                        key_type_to_str(keytype));
                exit(1);
            }
        } else if (longoptarg(arg, "--rsakexkey", &val, &argc, &argv)) {
            Filename *keyfile;
            int keytype;
            const char *error;

            keyfile = filename_from_str(val);
            keytype = key_type(keyfile);

            if (keytype != SSH_KEYTYPE_SSH1) {
                fprintf(stderr, "%s: '%s' is not loadable as an SSH-1 format "
                        "private key (%s)", appname, val,
                        key_type_to_str(keytype));
                exit(1);
            }

            if (ci->ssc.rsa_kex_key) {
                freersakey(ci->ssc.rsa_kex_key);
            } else {
                ci->ssc.rsa_kex_key = snew(RSAKey);
            }

            if (!rsa1_load_f(keyfile, ci->ssc.rsa_kex_key, NULL, &error)) {
                fprintf(stderr, "%s: unable to load RSA kex key '%s': "
                        "%s\n", appname, val, error);
                exit(1);
            }

            ci->ssc.rsa_kex_key->sshk.vt = &ssh_rsa;
        } else if (longoptarg(arg, "--userkey", &val, &argc, &argv)) {
            Filename *keyfile;
            int keytype;
            const char *error;

            keyfile = filename_from_str(val);
            keytype = key_type(keyfile);

            if (keytype == SSH_KEYTYPE_SSH2_PUBLIC_RFC4716 ||
                keytype == SSH_KEYTYPE_SSH2_PUBLIC_OPENSSH) {
                strbuf *sb = strbuf_new();
                struct AuthPolicy_ssh2_pubkey *node;
                void *blob;

                if (!ppk_loadpub_f(keyfile, NULL, BinarySink_UPCAST(sb),
                                   NULL, &error)) {
                    fprintf(stderr, "%s: unable to load user key '%s': "
                            "%s\n", appname, val, error);
                    exit(1);
                }

                node = snew_plus(struct AuthPolicy_ssh2_pubkey, sb->len);
                blob = snew_plus_get_aux(node);
                memcpy(blob, sb->u, sb->len);
                node->public_blob = make_ptrlen(blob, sb->len);

                node->next = ci->aps.ssh2keys;
                ci->aps.ssh2keys = node;

                strbuf_free(sb);
            } else if (keytype == SSH_KEYTYPE_SSH1_PUBLIC) {
                strbuf *sb = strbuf_new();
                BinarySource src[1];
                struct AuthPolicy_ssh1_pubkey *node;

                if (!rsa1_loadpub_f(keyfile, BinarySink_UPCAST(sb),
                                    NULL, &error)) {
                    fprintf(stderr, "%s: unable to load user key '%s': "
                            "%s\n", appname, val, error);
                    exit(1);
                }

                node = snew(struct AuthPolicy_ssh1_pubkey);
                BinarySource_BARE_INIT(src, sb->u, sb->len);
                get_rsa_ssh1_pub(src, &node->key, RSA_SSH1_EXPONENT_FIRST);

                node->next = ci->aps.ssh1keys;
                ci->aps.ssh1keys = node;

                strbuf_free(sb);
            } else {
                fprintf(stderr, "%s: '%s' is not loadable as a public key "
                        "(%s)\n", appname, val, key_type_to_str(keytype));
                exit(1);
            }
        } else if (longoptarg(arg, "--bannerfile", &val, &argc, &argv)) {
            FILE *fp = fopen(val, "r");
            if (!fp) {
                fprintf(stderr, "%s: %s: open: %s\n", appname,
                        val, strerror(errno));
                exit(1);
            }
            strbuf *sb = strbuf_new();
            if (!read_file_into(BinarySink_UPCAST(sb), fp)) {
                fprintf(stderr, "%s: %s: read: %s\n", appname,
                        val, strerror(errno));
                exit(1);
            }
            fclose(fp);
            ci->ssc.banner = ptrlen_from_strbuf(sb);
        } else if (longoptarg(arg, "--bannertext", &val, &argc, &argv)) {
            ci->ssc.banner = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--sessiondir", &val, &argc, &argv)) {
            ci->ssc.session_starting_dir = val;
        } else if (longoptarg(arg, "--kexinit-kex", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_KEX] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-hostkey", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_HOSTKEY] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-cscipher", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_CSCIPHER] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-csmac", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_CSMAC] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-cscomp", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_CSCOMP] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-sccipher", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_SCCIPHER] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-scmac", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_SCMAC] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-sccomp", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_SCCOMP] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--allow-auth", &val, &argc, &argv)) {
            unsigned method = auth_method_from_name(val);
            if (!method) {
                fprintf(stderr, "%s: unrecognised auth method '%s'\n",
                        appname, val);
                exit(1);
            }
            ci->auth_methods |= method;
        } else if (longoptarg(arg, "--deny-auth", &val, &argc, &argv)) {
            unsigned method = auth_method_from_name(val);
            if (!method) {
                fprintf(stderr, "%s: unrecognised auth method '%s'\n",
                        appname, val);
                exit(1);
            }
            ci->auth_methods &= ~method;
        } else if (longoptarg(arg, "--ssh1-ciphers", &val, &argc, &argv)) {
            ptrlen list = ptrlen_from_asciz(val);
            ptrlen word;
            unsigned long mask = 0;
            while (word = ptrlen_get_word(&list, ","), word.len != 0) {

#define SSH1_CIPHER_CASE(bitpos, name)                  \
                if (ptrlen_eq_string(word, name)) {     \
                    mask |= 1U << bitpos;               \
                    continue;                           \
                }
                SSH1_SUPPORTED_CIPHER_LIST(SSH1_CIPHER_CASE);
#undef SSH1_CIPHER_CASE

                fprintf(stderr, "%s: unrecognised SSH-1 cipher '%.*s'\n",
                        appname, PTRLEN_PRINTF(word));
                exit(1);
            }
            ci->ssc.ssh1_cipher_mask = mask;
        } else if (longoptnoarg(arg, "--ssh1-no-compression")) {
            ci->ssc.ssh1_allow_compression = false;
        } else if (longoptnoarg(arg, "--exitsignum")) {
            ci->ssc.exit_signal_numeric = true;
        } else if (longoptarg(arg, "--sshlog", &val, &argc, &argv) ||
                   longoptarg(arg, "-sshlog", &val, &argc, &argv)) {
            Filename *logfile = filename_from_str(val);
            conf_set_filename(ci->conf, CONF_logfilename, logfile);
            filename_free(logfile);
            conf_set_int(ci->conf, CONF_logtype, LGTYP_PACKETS);
            conf_set_int(ci->conf, CONF_logxfovr, LGXF_OVR);
        } else if (longoptarg(arg, "--sshrawlog", &val, &argc, &argv) ||
                   longoptarg(arg, "-sshrawlog", &val, &argc, &argv)) {
            Filename *logfile = filename_from_str(val);
            conf_set_filename(ci->conf, CONF_logfilename, logfile);
            filename_free(logfile);
            conf_set_int(ci->conf, CONF_logtype, LGTYP_SSHRAW);
            conf_set_int(ci->conf, CONF_logxfovr, LGXF_OVR);
        } else if (!strcmp(arg, "--pretend-to-accept-any-pubkey")) {
            ci->ssc.stunt_pretend_to_accept_any_pubkey = true;
        } else if (!strcmp(arg, "--open-unconditional-agent-socket")) {
            ci->ssc.stunt_open_unconditional_agent_socket = true;
        } else if (!strcmp(arg, "--allow-none-auth")) {
            /* backwards-compatibility synonym for --allow-auth=none */
            ci->auth_methods |= AUTHMETHOD_NONE;
        } else if (!strcmp(arg, "--allow-trivial-ki-auth")) {
            ci->ssc.stunt_allow_trivial_ki_auth = true;
        } else if (!strcmp(arg, "--return-success-to-pubkey-offer")) {
            ci->ssc.stunt_return_success_to_pubkey_offer = true;
        } else {
            fprintf(stderr, "%s: unrecognised option '%s'\n", appname, arg);
            exit(1);
        }
    }

    if (ninstances > 1 && listen_once) {
        fprintf(stderr, "%s: cannot listen once only with multiple server "
                "instances\n", appname);
        exit(1);
    }
    for (size_t i = 0; i < ninstances; i++) {
        ci = &instances[i];
        if (ci->nhostkeys == 0 && !ci->hostkey1) {
            fprintf(stderr, "%s: specify at least one host key\n", appname);
            exit(1);
        }
        if (ninstances > 1 && !(ci->listen_port >= 0 || ci->listen_socket)) {
            fprintf(stderr, "%s: cannot talk to stdio with multiple server "
                    "instances\n", appname);
            exit(1);
        }
    }

    random_ref();

    /*
     * Block SIGPIPE, so that we'll get EPIPE individually on
     * particular network connections that go wrong.
     */
    putty_signal(SIGPIPE, SIG_IGN);

    sk_init();
    uxsel_init();

    for (size_t i = 0; i < ninstances; i++)
        cmdline_instance_start(&instances[i]);

    cli_main_loop(cliloop_no_pw_setup, cliloop_no_pw_check,
                  cliloop_always_continue, NULL);

    return 0;
}